

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void handle_clipboard_timestamp(int clipboard,Time time)

{
  Time *pTVar1;
  Time *timestamp;
  Time time_local;
  int clipboard_local;
  
  pTVar1 = &primary_timestamp;
  if (clipboard != 0) {
    pTVar1 = &clipboard_timestamp;
  }
  if ((have_xfixes) || (*pTVar1 != 0xffffffffffffffff)) {
    if (time != *pTVar1) {
      *pTVar1 = time;
      if (fl_event_time < time) {
        fl_event_time = time;
      }
      fl_trigger_clipboard_notify(clipboard);
    }
  }
  else {
    *pTVar1 = time;
  }
  return;
}

Assistant:

static void handle_clipboard_timestamp(int clipboard, Time time)
{
  Time *timestamp;

  timestamp = clipboard ? &clipboard_timestamp : &primary_timestamp;

#if HAVE_XFIXES
  if (!have_xfixes)
#endif
  {
    // Initial scan, just store the value
    if (*timestamp == (Time)-1) {
      *timestamp = time;
      return;
    }
  }

  // Same selection
  if (time == *timestamp)
    return;

  *timestamp = time;

  // The clipboard change is the event that caused us to request
  // the clipboard data, so use that time as the latest event.
  if (time > fl_event_time)
    fl_event_time = time;

  // Something happened! Let's tell someone!
  fl_trigger_clipboard_notify(clipboard);
}